

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype i,QPersistentModelIndex *args)

{
  qsizetype *pqVar1;
  QPersistentModelIndex **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QPersistentModelIndex *pQVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex *pQVar7;
  QPersistentModelIndex *__dest;
  QPersistentModelIndexData *__old_val;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_68;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
           super_QArrayDataPointer<QPersistentModelIndex>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
            super_QArrayDataPointer<QPersistentModelIndex>.size;
    if ((lVar4 == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      pQVar6 = args->d;
      args->d = (QPersistentModelIndexData *)0x0;
      pQVar5[i].d = pQVar6;
      (this->super_QGenericArrayOps<QPersistentModelIndex>).
      super_QArrayDataPointer<QPersistentModelIndex>.size = i + 1;
      goto LAB_00151253;
    }
    if ((i == 0) &&
       (pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr,
       (QPersistentModelIndex *)
       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar5)) {
      pQVar6 = args->d;
      args->d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].d = pQVar6;
      ppQVar2 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
      (this->super_QGenericArrayOps<QPersistentModelIndex>).
      super_QArrayDataPointer<QPersistentModelIndex>.size = lVar4 + 1;
      goto LAB_00151253;
    }
  }
  pQVar6 = args->d;
  args->d = (QPersistentModelIndexData *)0x0;
  bVar8 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
          super_QArrayDataPointer<QPersistentModelIndex>.size != 0;
  local_40.d = pQVar6;
  QArrayDataPointer<QPersistentModelIndex>::detachAndGrow
            ((QArrayDataPointer<QPersistentModelIndex> *)this,(uint)(i == 0 && bVar8),1,
             (QPersistentModelIndex **)0x0,(QArrayDataPointer<QPersistentModelIndex> *)0x0);
  if (i == 0 && bVar8) {
    pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
             super_QArrayDataPointer<QPersistentModelIndex>.ptr;
    local_40.d = (QPersistentModelIndexData *)0x0;
    pQVar5[-1].d = pQVar6;
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.ptr = pQVar5 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
              super_QArrayDataPointer<QPersistentModelIndex>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    pQVar7 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
             super_QArrayDataPointer<QPersistentModelIndex>.ptr;
    pQVar5 = pQVar7 + i;
    __dest = pQVar5 + 1;
    local_68.nInserts = 1;
    local_68.bytes =
         ((this->super_QGenericArrayOps<QPersistentModelIndex>).
          super_QArrayDataPointer<QPersistentModelIndex>.size - i) * 8;
    local_68.data = (QArrayDataPointer<QPersistentModelIndex> *)this;
    local_68.displaceTo = __dest;
    memmove(__dest,pQVar7 + i,local_68.bytes);
    local_40.d = (QPersistentModelIndexData *)0x0;
    pQVar5->d = pQVar6;
    local_68.displaceFrom = __dest;
    Inserter::~Inserter(&local_68);
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_00151253:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }